

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

void __thiscall tinyxml2::StrPair::CollapseWhitespace(StrPair *this)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  byte *pbVar4;
  byte *pbVar5;
  
  pbVar5 = (byte *)this->_start;
  bVar2 = *pbVar5;
  while ((-1 < (char)bVar2 && (iVar3 = isspace((uint)bVar2), iVar3 != 0))) {
    bVar2 = pbVar5[1];
    pbVar5 = pbVar5 + 1;
  }
  this->_start = (char *)pbVar5;
  if (*pbVar5 != 0) {
    bVar2 = *pbVar5;
    pbVar4 = pbVar5;
    while (bVar2 != 0) {
      if ((-1 < (char)bVar2) && (iVar3 = isspace((uint)bVar2), iVar3 != 0)) {
        while ((-1 < (char)bVar2 && (iVar3 = isspace((uint)bVar2), iVar3 != 0))) {
          bVar2 = pbVar4[1];
          pbVar4 = pbVar4 + 1;
        }
        if (*pbVar4 == 0) break;
        *pbVar5 = 0x20;
        pbVar5 = pbVar5 + 1;
      }
      *pbVar5 = *pbVar4;
      pbVar5 = pbVar5 + 1;
      pbVar1 = pbVar4 + 1;
      pbVar4 = pbVar4 + 1;
      bVar2 = *pbVar1;
    }
    *pbVar5 = 0;
  }
  return;
}

Assistant:

void StrPair::CollapseWhitespace()
{
    // Adjusting _start would cause undefined behavior on delete[]
    TIXMLASSERT( ( _flags & NEEDS_DELETE ) == 0 );
    // Trim leading space.
    _start = XMLUtil::SkipWhiteSpace( _start );

    if ( *_start ) {
        char* p = _start;	// the read pointer
        char* q = _start;	// the write pointer

        while( *p ) {
            if ( XMLUtil::IsWhiteSpace( *p )) {
                p = XMLUtil::SkipWhiteSpace( p );
                if ( *p == 0 ) {
                    break;    // don't write to q; this trims the trailing space.
                }
                *q = ' ';
                ++q;
            }
            *q = *p;
            ++q;
            ++p;
        }
        *q = 0;
    }
}